

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O2

void Lib::
     OutputAll<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_unsigned_int,_const_char_*>
     ::apply(ostream *out,char *m,
            basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ms,char *ms_1,
            uint ms_2,char *ms_3)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator<<(out,m);
  std::__cxx11::string::string((string *)&local_50,(string *)ms);
  OutputAll<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_unsigned_int,_const_char_*>
  ::apply(out,&local_50,ms_1,ms_2,ms_3);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

static void apply(std::ostream& out, M m, Ms... ms) {
    out << m;
    OutputAll<Ms...>::apply(out, ms...);
  }